

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::SetSimpleJitCallCount
          (FunctionExecutionStateMachine *this,uint16 simpleJitLimit)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  FunctionEntryPointInfo *pFVar6;
  FunctionEntryPointInfo *pFVar7;
  unsigned_short *puVar8;
  Type local_2c;
  unsigned_short local_16;
  byte local_13;
  uint16 local_12;
  uint8 limit;
  FunctionExecutionStateMachine *pFStack_10;
  uint16 simpleJitLimit_local;
  FunctionExecutionStateMachine *this_local;
  
  local_12 = simpleJitLimit;
  pFStack_10 = this;
  EVar2 = GetExecutionMode(this);
  if (EVar2 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x149,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar5 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  pFVar6 = FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar5);
  pFVar5 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo(pFVar5);
  if (pFVar6 != pFVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x14a,
                                "(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo())"
                                ,
                                "owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_16 = 0xff;
  puVar8 = min<unsigned_short>(&local_16,&local_12);
  local_13 = (byte)*puVar8;
  if (local_13 == 0) {
    local_2c = 0;
  }
  else {
    local_2c = local_13 - 1;
  }
  pFVar5 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  pFVar6 = FunctionBody::GetSimpleJitEntryPointInfo(pFVar5);
  pFVar6->callsCount = local_2c;
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetSimpleJitCallCount(const uint16 simpleJitLimit) const
    {
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
        Assert(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo());

        // Simple JIT counts down and transitions on overflow
        const uint8 limit = static_cast<uint8>(min(0xffui16, simpleJitLimit));
        owner->GetSimpleJitEntryPointInfo()->callsCount = limit == 0 ? 0 : limit - 1;
    }